

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColPivHouseholderQR.h
# Opt level: O0

void __thiscall
Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::computeInPlace
          (ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this)

{
  Scalar SVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Scalar SVar4;
  int iVar5;
  Index IVar6;
  Scalar *pSVar7;
  RealScalar *pRVar8;
  Scalar *pSVar9;
  Scalar *pSVar10;
  Scalar *pSVar11;
  Scalar *pSVar12;
  RealScalar RVar13;
  ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar14;
  RealScalar RVar15;
  Scalar SVar16;
  Real RVar17;
  type tVar18;
  double extraout_XMM0_Qa;
  RealScalar extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  RealScalar RVar19;
  double dVar20;
  double local_460;
  int local_3f4;
  undefined1 local_3f0 [4];
  PermIndexType k_2;
  Type local_3c0;
  double local_360;
  double local_358;
  RealScalar temp2;
  RealScalar temp;
  Index j;
  Type local_310;
  Type local_2b0;
  ColXpr local_278;
  Type local_248;
  Scalar local_1e8;
  RealScalar beta;
  ColXpr local_1b0;
  Type local_180;
  Scalar local_148;
  type local_140;
  RealScalar biggest_col_sq_norm;
  Index biggest_col_index;
  Index k_1;
  double local_120;
  RealScalar norm_downdate_threshold;
  double local_110;
  RealScalar threshold_helper;
  long local_d8;
  Index k;
  Index number_of_transpositions;
  Index size;
  Index cols;
  Index rows;
  ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this_local;
  RealScalar *local_90;
  Packet2d local_88;
  Index *local_70;
  Real local_68;
  undefined8 uStack_60;
  RealScalar local_58;
  undefined8 uStack_50;
  Real local_48;
  undefined8 uStack_40;
  Real local_30;
  RealScalar local_28;
  undefined8 uStack_20;
  RealScalar local_10;
  
  rows = (Index)this;
  check_template_parameters();
  IVar6 = PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this);
  iVar5 = GenericNumTraits<int>::highest();
  if (iVar5 < IVar6) {
    __assert_fail("m_qr.cols()<=NumTraits<int>::highest()",
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/QR/ColPivHouseholderQR.h"
                  ,0x1e7,
                  "void Eigen::ColPivHouseholderQR<Eigen::Matrix<double, 3, 3>>::computeInPlace() [MatrixType = Eigen::Matrix<double, 3, 3>]"
                 );
  }
  cols = PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::rows
                   ((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this);
  size = PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::cols
                   ((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this);
  number_of_transpositions =
       MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::diagonalSize
                 ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this);
  PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::resize
            (&(this->m_hCoeffs).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,
             number_of_transpositions);
  PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::resize
            (&(this->m_temp).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,size);
  IVar6 = PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this);
  PlainObjectBase<Eigen::Matrix<long,_1,_3,_1,_1,_3>_>::resize
            (&(this->m_colsTranspositions).
              super_PlainObjectBase<Eigen::Matrix<long,_1,_3,_1,_1,_3>_>,IVar6);
  k = 0;
  PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::resize
            (&(this->m_colNormsUpdated).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
             ,size);
  PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::resize
            (&(this->m_colNormsDirect).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,
             size);
  for (local_d8 = 0; local_d8 < size; local_d8 = local_d8 + 1) {
    DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              ((ColXpr *)&threshold_helper,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this,
               local_d8);
    RVar15 = MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::norm
                       ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                         *)&threshold_helper);
    pSVar7 = PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::coeffRef
                       (&(this->m_colNormsDirect).
                         super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,local_d8);
    *pSVar7 = RVar15;
    pSVar7 = PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::coeffRef
                       (&(this->m_colNormsDirect).
                         super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,local_d8);
    SVar1 = *pSVar7;
    pSVar7 = PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::coeffRef
                       (&(this->m_colNormsUpdated).
                         super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,local_d8);
    *pSVar7 = SVar1;
  }
  SVar16 = DenseBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::maxCoeff
                     ((DenseBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&this->m_colNormsUpdated);
  RVar17 = GenericNumTraits<double>::epsilon();
  norm_downdate_threshold = SVar16 * RVar17;
  tVar18 = numext::abs2<double>(&norm_downdate_threshold);
  local_110 = tVar18 / (double)cols;
  k_1 = (Index)GenericNumTraits<double>::epsilon();
  local_70 = &k_1;
  uStack_40 = 0;
  uStack_60 = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = k_1;
  local_88 = (Packet2d)sqrtpd(auVar2,auVar2);
  local_68 = (Real)k_1;
  local_48 = (Real)k_1;
  local_30 = (Real)k_1;
  local_120 = internal::pfirst<double__vector(2)>(&local_88);
  this->m_nonzero_pivots = number_of_transpositions;
  this->m_maxpivot = 0.0;
  for (biggest_col_index = 0; biggest_col_index < number_of_transpositions;
      biggest_col_index = biggest_col_index + 1) {
    DenseBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::tail<long>
              (&local_180,
               (DenseBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&this->m_colNormsUpdated,
               size - biggest_col_index);
    local_148 = DenseBase<Eigen::Block<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1,_-1,_false>_>::
                maxCoeff<long>((DenseBase<Eigen::Block<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1,__1,_false>_>
                                *)&local_180,(long *)&biggest_col_sq_norm);
    local_140 = numext::abs2<double>(&local_148);
    RVar13 = (RealScalar)(biggest_col_index + (long)biggest_col_sq_norm);
    if ((this->m_nonzero_pivots == number_of_transpositions) &&
       (local_140 < local_110 * (double)(cols - biggest_col_index))) {
      this->m_nonzero_pivots = biggest_col_index;
    }
    biggest_col_sq_norm = RVar13;
    pRVar8 = (RealScalar *)
             PlainObjectBase<Eigen::Matrix<long,_1,_3,_1,_1,_3>_>::coeffRef
                       (&(this->m_colsTranspositions).
                         super_PlainObjectBase<Eigen::Matrix<long,_1,_3,_1,_1,_3>_>,
                        biggest_col_index);
    *pRVar8 = RVar13;
    if ((RealScalar)biggest_col_index != biggest_col_sq_norm) {
      DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                (&local_1b0,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this,
                 biggest_col_index);
      DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                ((ColXpr *)&beta,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this,
                 (Index)biggest_col_sq_norm);
      DenseBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>::
      swap<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
                ((DenseBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>> *)&local_1b0,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)&beta
                );
      pSVar7 = PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::coeffRef
                         (&(this->m_colNormsUpdated).
                           super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,
                          biggest_col_index);
      pSVar9 = PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::coeffRef
                         (&(this->m_colNormsUpdated).
                           super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,
                          (Index)biggest_col_sq_norm);
      std::swap<double>(pSVar7,pSVar9);
      pSVar7 = PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::coeffRef
                         (&(this->m_colNormsDirect).
                           super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,
                          biggest_col_index);
      pSVar9 = PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::coeffRef
                         (&(this->m_colNormsDirect).
                           super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,
                          (Index)biggest_col_sq_norm);
      std::swap<double>(pSVar7,pSVar9);
      k = k + 1;
    }
    DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              (&local_278,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this,biggest_col_index
              );
    DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::tail<long>
              (&local_248,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
               &local_278,cols - biggest_col_index);
    pSVar10 = PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::coeffRef
                        (&(this->m_hCoeffs).
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,
                         biggest_col_index);
    MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_-1,_1,_false>_>
    ::makeHouseholderInPlace
              ((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>
                *)&local_248,pSVar10,&local_1e8);
    SVar4 = local_1e8;
    pCVar14 = this;
    pSVar11 = PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::coeffRef
                        ((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this,
                         biggest_col_index,biggest_col_index);
    *pSVar11 = SVar4;
    iVar5 = (int)pCVar14;
    std::abs(iVar5);
    if (this->m_maxpivot <= extraout_XMM0_Qa && extraout_XMM0_Qa != this->m_maxpivot) {
      std::abs(iVar5);
      this->m_maxpivot = extraout_XMM0_Qa_00;
    }
    DenseBase<Eigen::Matrix<double,3,3,0,3,3>>::bottomRightCorner<long,long>
              (&local_2b0,this,cols - biggest_col_index,(size - biggest_col_index) + -1);
    DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
              ((ColXpr *)&j,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this,
               biggest_col_index);
    DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::tail<long>
              (&local_310,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)&j,
               (cols - biggest_col_index) + -1);
    pSVar10 = PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::coeffRef
                        (&(this->m_hCoeffs).
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,
                         biggest_col_index);
    pSVar7 = PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::coeffRef
                       (&(this->m_temp).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
                        ,biggest_col_index + 1);
    MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,-1,-1,false>>::
    applyHouseholderOnTheLeft<Eigen::VectorBlock<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,_1>>
              ((MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,_1,_1,false>> *)&local_2b0,
               &local_310,pSVar10,pSVar7);
    temp = (RealScalar)biggest_col_index;
    while (temp = (RealScalar)((long)temp + 1), (long)temp < size) {
      pSVar7 = PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::coeffRef
                         (&(this->m_colNormsUpdated).
                           super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,(Index)temp)
      ;
      if ((*pSVar7 != 0.0) || (NAN(*pSVar7))) {
        pCVar14 = this;
        PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::coeffRef
                  ((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this,biggest_col_index,
                   (Index)temp);
        std::abs((int)pCVar14);
        pSVar7 = PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::coeffRef
                           (&(this->m_colNormsUpdated).
                             super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,
                            (Index)temp);
        local_460 = (extraout_XMM0_Qa_01 / *pSVar7 + 1.0) * (1.0 - extraout_XMM0_Qa_01 / *pSVar7);
        if (local_460 < 0.0) {
          local_460 = 0.0;
        }
        temp2 = local_460;
        pSVar7 = PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::coeffRef
                           (&(this->m_colNormsUpdated).
                             super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,
                            (Index)temp);
        dVar20 = *pSVar7;
        pSVar7 = PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::coeffRef
                           (&(this->m_colNormsDirect).
                             super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,
                            (Index)temp);
        local_360 = dVar20 / *pSVar7;
        tVar18 = numext::abs2<double>(&local_360);
        local_358 = local_460 * tVar18;
        if (local_120 < local_358) {
          local_90 = &temp2;
          local_58 = temp2;
          uStack_20 = 0;
          uStack_50 = 0;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = temp2;
          _this_local = (Packet2d)sqrtpd(auVar3,auVar3);
          local_28 = local_58;
          local_10 = local_58;
          dVar20 = internal::pfirst<double__vector(2)>((Packet2d *)&this_local);
          pSVar7 = PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::coeffRef
                             (&(this->m_colNormsUpdated).
                               super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,
                              (Index)temp);
          *pSVar7 = dVar20 * *pSVar7;
        }
        else {
          DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                    ((ColXpr *)local_3f0,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this,
                     (Index)temp);
          DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::tail<long>
                    (&local_3c0,
                     (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                     local_3f0,(cols - biggest_col_index) + -1);
          RVar19 = MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_-1,_1,_false>_>
                   ::norm((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>
                           *)&local_3c0);
          pSVar7 = PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::coeffRef
                             (&(this->m_colNormsDirect).
                               super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,
                              (Index)temp);
          *pSVar7 = RVar19;
          pSVar7 = PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::coeffRef
                             (&(this->m_colNormsDirect).
                               super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,
                              (Index)temp);
          SVar1 = *pSVar7;
          pSVar7 = PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::coeffRef
                             (&(this->m_colNormsUpdated).
                               super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,
                              (Index)temp);
          *pSVar7 = SVar1;
        }
      }
    }
  }
  PermutationBase<Eigen::PermutationMatrix<3,_3,_int>_>::setIdentity
            ((PermutationBase<Eigen::PermutationMatrix<3,_3,_int>_> *)&this->m_colsPermutation,
             (long)(int)size);
  for (local_3f4 = 0; local_3f4 < number_of_transpositions; local_3f4 = local_3f4 + 1) {
    pSVar12 = PlainObjectBase<Eigen::Matrix<long,_1,_3,_1,_1,_3>_>::coeff
                        (&(this->m_colsTranspositions).
                          super_PlainObjectBase<Eigen::Matrix<long,_1,_3,_1,_1,_3>_>,(long)local_3f4
                        );
    PermutationBase<Eigen::PermutationMatrix<3,_3,_int>_>::applyTranspositionOnTheRight
              ((PermutationBase<Eigen::PermutationMatrix<3,_3,_int>_> *)&this->m_colsPermutation,
               (long)local_3f4,(long)(int)*pSVar12);
  }
  iVar5 = 1;
  if (k % 2 != 0) {
    iVar5 = -1;
  }
  this->m_det_pq = (long)iVar5;
  this->m_isInitialized = true;
  return;
}

Assistant:

void ColPivHouseholderQR<MatrixType>::computeInPlace()
{
  check_template_parameters();

  // the column permutation is stored as int indices, so just to be sure:
  eigen_assert(m_qr.cols()<=NumTraits<int>::highest());

  using std::abs;

  Index rows = m_qr.rows();
  Index cols = m_qr.cols();
  Index size = m_qr.diagonalSize();

  m_hCoeffs.resize(size);

  m_temp.resize(cols);

  m_colsTranspositions.resize(m_qr.cols());
  Index number_of_transpositions = 0;

  m_colNormsUpdated.resize(cols);
  m_colNormsDirect.resize(cols);
  for (Index k = 0; k < cols; ++k) {
    // colNormsDirect(k) caches the most recent directly computed norm of
    // column k.
    m_colNormsDirect.coeffRef(k) = m_qr.col(k).norm();
    m_colNormsUpdated.coeffRef(k) = m_colNormsDirect.coeffRef(k);
  }

  RealScalar threshold_helper =  numext::abs2<RealScalar>(m_colNormsUpdated.maxCoeff() * NumTraits<RealScalar>::epsilon()) / RealScalar(rows);
  RealScalar norm_downdate_threshold = numext::sqrt(NumTraits<RealScalar>::epsilon());

  m_nonzero_pivots = size; // the generic case is that in which all pivots are nonzero (invertible case)
  m_maxpivot = RealScalar(0);

  for(Index k = 0; k < size; ++k)
  {
    // first, we look up in our table m_colNormsUpdated which column has the biggest norm
    Index biggest_col_index;
    RealScalar biggest_col_sq_norm = numext::abs2(m_colNormsUpdated.tail(cols-k).maxCoeff(&biggest_col_index));
    biggest_col_index += k;

    // Track the number of meaningful pivots but do not stop the decomposition to make
    // sure that the initial matrix is properly reproduced. See bug 941.
    if(m_nonzero_pivots==size && biggest_col_sq_norm < threshold_helper * RealScalar(rows-k))
      m_nonzero_pivots = k;

    // apply the transposition to the columns
    m_colsTranspositions.coeffRef(k) = biggest_col_index;
    if(k != biggest_col_index) {
      m_qr.col(k).swap(m_qr.col(biggest_col_index));
      std::swap(m_colNormsUpdated.coeffRef(k), m_colNormsUpdated.coeffRef(biggest_col_index));
      std::swap(m_colNormsDirect.coeffRef(k), m_colNormsDirect.coeffRef(biggest_col_index));
      ++number_of_transpositions;
    }

    // generate the householder vector, store it below the diagonal
    RealScalar beta;
    m_qr.col(k).tail(rows-k).makeHouseholderInPlace(m_hCoeffs.coeffRef(k), beta);

    // apply the householder transformation to the diagonal coefficient
    m_qr.coeffRef(k,k) = beta;

    // remember the maximum absolute value of diagonal coefficients
    if(abs(beta) > m_maxpivot) m_maxpivot = abs(beta);

    // apply the householder transformation
    m_qr.bottomRightCorner(rows-k, cols-k-1)
        .applyHouseholderOnTheLeft(m_qr.col(k).tail(rows-k-1), m_hCoeffs.coeffRef(k), &m_temp.coeffRef(k+1));

    // update our table of norms of the columns
    for (Index j = k + 1; j < cols; ++j) {
      // The following implements the stable norm downgrade step discussed in
      // http://www.netlib.org/lapack/lawnspdf/lawn176.pdf
      // and used in LAPACK routines xGEQPF and xGEQP3.
      // See lines 278-297 in http://www.netlib.org/lapack/explore-html/dc/df4/sgeqpf_8f_source.html
      if (m_colNormsUpdated.coeffRef(j) != RealScalar(0)) {
        RealScalar temp = abs(m_qr.coeffRef(k, j)) / m_colNormsUpdated.coeffRef(j);
        temp = (RealScalar(1) + temp) * (RealScalar(1) - temp);
        temp = temp <  RealScalar(0) ? RealScalar(0) : temp;
        RealScalar temp2 = temp * numext::abs2<RealScalar>(m_colNormsUpdated.coeffRef(j) /
                                                           m_colNormsDirect.coeffRef(j));
        if (temp2 <= norm_downdate_threshold) {
          // The updated norm has become too inaccurate so re-compute the column
          // norm directly.
          m_colNormsDirect.coeffRef(j) = m_qr.col(j).tail(rows - k - 1).norm();
          m_colNormsUpdated.coeffRef(j) = m_colNormsDirect.coeffRef(j);
        } else {
          m_colNormsUpdated.coeffRef(j) *= numext::sqrt(temp);
        }
      }
    }
  }

  m_colsPermutation.setIdentity(PermIndexType(cols));
  for(PermIndexType k = 0; k < size/*m_nonzero_pivots*/; ++k)
    m_colsPermutation.applyTranspositionOnTheRight(k, PermIndexType(m_colsTranspositions.coeff(k)));

  m_det_pq = (number_of_transpositions%2) ? -1 : 1;
  m_isInitialized = true;
}